

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTest.cc
# Opt level: O1

void check_string(char *file,int line,string *expected,string *received)

{
  size_t __n;
  int iVar1;
  logic_error *this;
  undefined8 extraout_RAX;
  
  __n = expected->_M_string_length;
  if (__n == received->_M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((expected->_M_dataplus)._M_p,(received->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_00105c16;
    }
    return;
  }
LAB_00105c16:
  fprintf(_stderr,"(%s:%d) Strings do not match; expected:\n",file);
  phosg::print_data((FILE *)_stderr,expected,0,(void *)0x0,2);
  fwrite("Received:\n",10,1,_stderr);
  phosg::print_data((FILE *)_stderr,received,0,(void *)0x0,2);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Strings do not match");
  check_string();
  __cxa_free_exception(this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void check_string(const char* file, int line, const string& expected, const string& received) {
  if (expected != received) {
    fprintf(stderr, "(%s:%d) Strings do not match; expected:\n", file, line);
    print_data(stderr, expected);
    fprintf(stderr, "Received:\n");
    print_data(stderr, received);
    throw logic_error("Strings do not match");
  }
}